

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::ProductState,double,duckdb::ProductFunction>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  unsigned_long uVar12;
  double dVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar7 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar1[uVar6];
        }
        uVar9 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar9 = count;
        }
        uVar10 = uVar9;
        if (uVar12 != 0) {
          uVar10 = uVar7;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar7 < uVar9) {
              bVar5 = *state;
              dVar13 = *(double *)(state + 8);
              do {
                if ((bVar5 & 1) != 0) {
                  *state = '\0';
                  bVar5 = 0;
                }
                dVar13 = dVar13 * *(double *)(pdVar3 + uVar7 * 8);
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
              *(double *)(state + 8) = dVar13;
              uVar10 = uVar9;
            }
          }
          else if (uVar7 < uVar9) {
            uVar10 = 0;
            do {
              if ((uVar12 >> (uVar10 & 0x3f) & 1) != 0) {
                if (*state == '\x01') {
                  *state = '\0';
                }
                *(double *)(state + 8) =
                     *(double *)(pdVar3 + uVar10 * 8 + uVar7 * 8) * *(double *)(state + 8);
              }
              uVar10 = uVar10 + 1;
            } while ((uVar7 - uVar9) + uVar10 != 0);
            uVar10 = uVar7 + uVar10;
          }
        }
        uVar7 = uVar10;
        uVar6 = uVar6 + 1;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) && (count != 0)) {
      pdVar2 = (double *)input->data;
      bVar5 = *state;
      do {
        if ((bVar5 & 1) != 0) {
          *state = '\0';
          bVar5 = 0;
        }
        *(double *)(state + 8) = *pdVar2 * *(double *)(state + 8);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_68.sel)->sel_vector;
        bVar5 = *state;
        dVar13 = *(double *)(state + 8);
        iVar8 = 0;
        do {
          iVar11 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar4[iVar8];
          }
          if ((bVar5 & 1) != 0) {
            *state = '\0';
            bVar5 = 0;
          }
          dVar13 = dVar13 * *(double *)(local_68.data + iVar11 * 8);
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
        *(double *)(state + 8) = dVar13;
      }
    }
    else if (count != 0) {
      psVar4 = (local_68.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar11 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar4[iVar8];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          if (*state == '\x01') {
            *state = '\0';
          }
          *(double *)(state + 8) = *(double *)(local_68.data + iVar11 * 8) * *(double *)(state + 8);
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}